

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string * el::base::utils::OS::getBashOutput_abi_cxx11_(char *command)

{
  char *pcVar1;
  char *in_RSI;
  string *in_RDI;
  size_t buffLen;
  char hBuff [4096];
  FILE *proc;
  allocator local_1021;
  undefined8 local_1020;
  char local_1018 [4096];
  FILE *local_18;
  
  if (in_RSI == (char *)0x0) {
    ::std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    local_18 = (FILE *)0x0;
    local_18 = popen(in_RSI,"r");
    if (local_18 == (FILE *)0x0) {
      ::std::__cxx11::string::string((string *)in_RDI);
    }
    else {
      pcVar1 = fgets(local_1018,0x1000,local_18);
      if (pcVar1 == (char *)0x0) {
        pclose(local_18);
        ::std::__cxx11::string::string((string *)in_RDI);
      }
      else {
        pclose(local_18);
        local_1020 = strlen(local_1018);
        if ((local_1020 != 0) && (local_1018[local_1020 - 1] == '\n')) {
          local_1018[local_1020 - 1] = '\0';
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)in_RDI,local_1018,&local_1021);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1021);
      }
    }
  }
  return in_RDI;
}

Assistant:

const std::string OS::getBashOutput(const char* command) {
#if (ELPP_OS_UNIX && !ELPP_OS_ANDROID && !ELPP_CYGWIN)
  if (command == nullptr) {
    return std::string();
  }
  FILE* proc = nullptr;
  if ((proc = popen(command, "r")) == nullptr) {
    ELPP_INTERNAL_ERROR("\nUnable to run command [" << command << "]", true);
    return std::string();
  }
  char hBuff[4096];
  if (fgets(hBuff, sizeof(hBuff), proc) != nullptr) {
    pclose(proc);
    const std::size_t buffLen = strlen(hBuff);
    if (buffLen > 0 && hBuff[buffLen - 1] == '\n') {
      hBuff[buffLen - 1] = '\0';
    }
    return std::string(hBuff);
  } else {
    pclose(proc);
  }
  return std::string();
#else
  ELPP_UNUSED(command);
  return std::string();
#endif  // (ELPP_OS_UNIX && !ELPP_OS_ANDROID && !ELPP_CYGWIN)
}